

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::detail::generic_type::mark_parents_nonsimple(generic_type *this,PyTypeObject *value)

{
  object value_00;
  bool bVar1;
  type_info *ptVar2;
  iterator *self;
  iterator __begin2;
  tuple t;
  iterator __end2;
  iterator local_68;
  object local_50;
  iterator local_48;
  
  local_50.super_handle.m_ptr = (handle)value->tp_bases;
  if (local_50.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_50.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_50.super_handle.m_ptr)->ob_refcnt + 1;
  }
  local_68.super_object.super_handle.m_ptr = (handle)PyObject_GetIter();
  local_68.ready = false;
  local_68.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_48.ready = false;
  local_48.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
  while( true ) {
    bVar1 = iterator::operator!=(&local_68,&local_48);
    if (!bVar1) break;
    if ((local_68.ready == false) && (local_68.super_object.super_handle.m_ptr != (PyObject *)0x0))
    {
      iterator::advance(&local_68);
      local_68.ready = true;
    }
    value_00.super_handle.m_ptr = (handle)(handle)local_68.value;
    ptVar2 = get_type_info((PyTypeObject *)local_68.value.super_handle.m_ptr);
    if (ptVar2 != (type_info *)0x0) {
      ptVar2->simple_type = false;
    }
    mark_parents_nonsimple(this,(PyTypeObject *)value_00.super_handle.m_ptr);
    if (local_68.super_object.super_handle.m_ptr != (PyObject *)0x0) {
      iterator::advance(&local_68);
    }
  }
  object::~object(&local_48.value);
  object::~object(&local_48.super_object);
  object::~object(&local_68.value);
  object::~object(&local_68.super_object);
  object::~object(&local_50);
  return;
}

Assistant:

void mark_parents_nonsimple(PyTypeObject *value) {
        auto t = reinterpret_borrow<tuple>(value->tp_bases);
        for (handle h : t) {
            auto tinfo2 = get_type_info((PyTypeObject *) h.ptr());
            if (tinfo2)
                tinfo2->simple_type = false;
            mark_parents_nonsimple((PyTypeObject *) h.ptr());
        }
    }